

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_sse2.c
# Opt level: O3

void blake3_hash4_sse2(uint8_t **inputs,size_t blocks,uint32_t *key,uint64_t counter,
                      _Bool increment_counter,uint8_t flags,uint8_t flags_start,uint8_t flags_end,
                      uint8_t *out)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  long lVar8;
  byte bVar9;
  size_t i;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  
  auVar11 = vpbroadcastd_avx512vl(ZEXT416(*key));
  auVar12 = vpbroadcastd_avx512vl(ZEXT416(key[1]));
  auVar13 = vpbroadcastd_avx512vl(ZEXT416(key[2]));
  auVar14 = vpbroadcastd_avx512vl(ZEXT416(key[3]));
  auVar15 = vpbroadcastd_avx512vl(ZEXT416(key[4]));
  auVar16 = vpbroadcastd_avx512vl(ZEXT416(key[5]));
  auVar17 = vpbroadcastd_avx512vl(ZEXT416(key[6]));
  auVar18 = vpbroadcastd_avx512vl(ZEXT416(key[7]));
  if (blocks != 0) {
    auVar19 = vpbroadcastd_avx512vl();
    auVar20 = vpbroadcastd_avx512vl();
    auVar51 = vpand_avx(auVar19,_DAT_0010c2c0);
    auVar19 = vpaddd_avx(auVar20,auVar51);
    auVar20._8_4_ = 0x80000000;
    auVar20._0_8_ = 0x8000000080000000;
    auVar20._12_4_ = 0x80000000;
    auVar51 = vpor_avx(auVar51,auVar20);
    auVar51 = vpcmpgtd_avx(auVar51,auVar19 ^ auVar20);
    auVar20 = vpbroadcastd_avx512vl();
    auVar51 = vpsubd_avx(auVar20,auVar51);
    puVar1 = *inputs;
    puVar2 = inputs[1];
    puVar3 = inputs[2];
    puVar4 = inputs[3];
    sVar5 = 0;
    bVar7 = flags_start | flags;
    do {
      sVar6 = sVar5 + 1;
      bVar9 = 0;
      if (sVar6 == blocks) {
        bVar9 = flags_end;
      }
      lVar8 = sVar5 * 0x40;
      auVar20 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar4 + lVar8));
      lVar10 = 0;
      do {
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      auVar21 = vpbroadcastd_avx512vl(ZEXT116(bVar9 | bVar7));
      auVar22 = vpunpckldq_avx512vl(*(undefined1 (*) [16])(puVar1 + lVar8),
                                    *(undefined1 (*) [16])(puVar2 + lVar8));
      auVar47 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar1 + lVar8),
                               *(undefined1 (*) [16])(puVar2 + lVar8));
      auVar23 = vpunpckldq_avx512vl(*(undefined1 (*) [16])(puVar3 + lVar8),auVar20);
      auVar24 = vpunpckhdq_avx512vl(*(undefined1 (*) [16])(puVar3 + lVar8),auVar20);
      auVar25 = vpunpcklqdq_avx512vl(auVar22,auVar23);
      auVar26 = vpunpckhqdq_avx512vl(auVar22,auVar23);
      auVar20 = vmovdqa64_avx512vl(auVar26);
      auVar27 = vpunpcklqdq_avx512vl(auVar47,auVar24);
      auVar28 = vpunpckhqdq_avx512vl(auVar47,auVar24);
      auVar23 = vpunpckldq_avx512vl(*(undefined1 (*) [16])(puVar1 + lVar8 + 0x10),
                                    *(undefined1 (*) [16])(puVar2 + lVar8 + 0x10));
      auVar47 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar1 + lVar8 + 0x10),
                               *(undefined1 (*) [16])(puVar2 + lVar8 + 0x10));
      auVar24 = vpunpckldq_avx512vl(*(undefined1 (*) [16])(puVar3 + lVar8 + 0x10),
                                    *(undefined1 (*) [16])(puVar4 + lVar8 + 0x10));
      auVar22 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar3 + lVar8 + 0x10),
                               *(undefined1 (*) [16])(puVar4 + lVar8 + 0x10));
      auVar29 = vpunpcklqdq_avx512vl(auVar23,auVar24);
      auVar30 = vpunpckhqdq_avx512vl(auVar23,auVar24);
      auVar31 = vpunpcklqdq_avx512vl(auVar47,auVar22);
      auVar24 = vpunpckhqdq_avx(auVar47,auVar22);
      auVar23 = vpunpckldq_avx(*(undefined1 (*) [16])(puVar1 + lVar8 + 0x20),
                               *(undefined1 (*) [16])(puVar2 + lVar8 + 0x20));
      auVar47 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar1 + lVar8 + 0x20),
                               *(undefined1 (*) [16])(puVar2 + lVar8 + 0x20));
      auVar48 = vpunpckldq_avx(*(undefined1 (*) [16])(puVar3 + lVar8 + 0x20),
                               *(undefined1 (*) [16])(puVar4 + lVar8 + 0x20));
      auVar22 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar3 + lVar8 + 0x20),
                               *(undefined1 (*) [16])(puVar4 + lVar8 + 0x20));
      auVar44 = vpunpcklqdq_avx(auVar23,auVar48);
      auVar32 = vpunpckhqdq_avx512vl(auVar23,auVar48);
      auVar49 = vpunpcklqdq_avx(auVar47,auVar22);
      auVar33 = vpunpckhqdq_avx512vl(auVar47,auVar22);
      auVar47 = vpunpckldq_avx(*(undefined1 (*) [16])(puVar1 + lVar8 + 0x30),
                               *(undefined1 (*) [16])(puVar2 + lVar8 + 0x30));
      auVar22 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar1 + lVar8 + 0x30),
                               *(undefined1 (*) [16])(puVar2 + lVar8 + 0x30));
      auVar48 = vpunpckldq_avx(*(undefined1 (*) [16])(puVar3 + lVar8 + 0x30),
                               *(undefined1 (*) [16])(puVar4 + lVar8 + 0x30));
      auVar23 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar3 + lVar8 + 0x30),
                               *(undefined1 (*) [16])(puVar4 + lVar8 + 0x30));
      auVar50 = vpunpcklqdq_avx(auVar47,auVar48);
      auVar48 = vpunpckhqdq_avx(auVar47,auVar48);
      auVar34 = vpunpcklqdq_avx512vl(auVar22,auVar23);
      auVar47 = vmovdqa64_avx512vl(auVar34);
      auVar22 = vpunpckhqdq_avx(auVar22,auVar23);
      auVar11 = vpaddd_avx512vl(auVar15,auVar11);
      auVar11 = vpaddd_avx(auVar25,auVar11);
      auVar12 = vpaddd_avx512vl(auVar16,auVar12);
      auVar12 = vpaddd_avx(auVar27,auVar12);
      auVar13 = vpaddd_avx512vl(auVar17,auVar13);
      auVar35 = vpaddd_avx512vl(auVar13,auVar29);
      auVar13 = vpaddd_avx512vl(auVar18,auVar14);
      auVar36 = vpaddd_avx512vl(auVar13,auVar31);
      auVar14 = vpxord_avx512vl(auVar36,auVar21);
      auVar37 = vprold_avx512vl(auVar11 ^ auVar19,0x10);
      auVar38 = vprold_avx512vl(auVar12 ^ auVar51,0x10);
      auVar13._8_4_ = 0x40;
      auVar13._0_8_ = 0x4000000040;
      auVar13._12_4_ = 0x40;
      auVar13 = vpxord_avx512vl(auVar35,auVar13);
      auVar13 = vprold_avx512vl(auVar13,0x10);
      auVar39 = vprold_avx512vl(auVar14,0x10);
      auVar14._8_4_ = 0x6a09e667;
      auVar14._0_8_ = 0x6a09e6676a09e667;
      auVar14._12_4_ = 0x6a09e667;
      auVar14 = vpaddd_avx512vl(auVar37,auVar14);
      auVar23._8_4_ = 0xbb67ae85;
      auVar23._0_8_ = 0xbb67ae85bb67ae85;
      auVar23._12_4_ = 0xbb67ae85;
      auVar23 = vpaddd_avx512vl(auVar38,auVar23);
      auVar21._8_4_ = 0x3c6ef372;
      auVar21._0_8_ = 0x3c6ef3723c6ef372;
      auVar21._12_4_ = 0x3c6ef372;
      auVar21 = vpaddd_avx512vl(auVar13,auVar21);
      auVar40._8_4_ = 0xa54ff53a;
      auVar40._0_8_ = 0xa54ff53aa54ff53a;
      auVar40._12_4_ = 0xa54ff53a;
      auVar40 = vpaddd_avx512vl(auVar39,auVar40);
      auVar15 = vpxord_avx512vl(auVar14,auVar15);
      auVar15 = vprold_avx512vl(auVar15,0x14);
      auVar16 = vpxord_avx512vl(auVar23,auVar16);
      auVar16 = vprold_avx512vl(auVar16,0x14);
      auVar17 = vpxord_avx512vl(auVar21,auVar17);
      auVar17 = vprold_avx512vl(auVar17,0x14);
      auVar18 = vpxord_avx512vl(auVar40,auVar18);
      auVar18 = vprold_avx512vl(auVar18,0x14);
      auVar26 = vpaddd_avx512vl(auVar11,auVar26);
      auVar11 = vpaddd_avx(auVar28,auVar12);
      auVar35 = vpaddd_avx512vl(auVar35,auVar30);
      auVar12 = vpaddd_avx(auVar24,auVar36);
      auVar26 = vpaddd_avx512vl(auVar26,auVar15);
      auVar36 = vpaddd_avx512vl(auVar11,auVar16);
      auVar35 = vpaddd_avx512vl(auVar35,auVar17);
      auVar41 = vpaddd_avx512vl(auVar12,auVar18);
      auVar37 = vprold_avx512vl(auVar26 ^ auVar37,0x18);
      auVar38 = vprold_avx512vl(auVar36 ^ auVar38,0x18);
      auVar11 = vpxord_avx512vl(auVar35,auVar13);
      auVar42 = vprold_avx512vl(auVar11,0x18);
      auVar11 = vpxord_avx512vl(auVar41,auVar39);
      auVar39 = vprold_avx512vl(auVar11,0x18);
      auVar14 = vpaddd_avx512vl(auVar37,auVar14);
      auVar23 = vpaddd_avx512vl(auVar38,auVar23);
      auVar21 = vpaddd_avx512vl(auVar42,auVar21);
      auVar40 = vpaddd_avx512vl(auVar39,auVar40);
      auVar11 = vpxord_avx512vl(auVar14,auVar15);
      auVar12 = vpxord_avx512vl(auVar23,auVar16);
      auVar13 = vpxord_avx512vl(auVar21,auVar17);
      auVar15 = vpxord_avx512vl(auVar40,auVar18);
      auVar18 = vprold_avx512vl(auVar11,0x19);
      auVar17 = vprold_avx512vl(auVar12,0x19);
      auVar16 = vprold_avx512vl(auVar13,0x19);
      auVar15 = vprold_avx512vl(auVar15,0x19);
      auVar11 = vpaddd_avx(auVar26,auVar44);
      auVar12 = vpaddd_avx(auVar49,auVar36);
      auVar13 = vpaddd_avx(auVar50,auVar35);
      auVar26 = vpaddd_avx512vl(auVar41,auVar34);
      auVar34 = vpaddd_avx512vl(auVar11,auVar17);
      auVar12 = vpaddd_avx512vl(auVar12,auVar16);
      auVar13 = vpaddd_avx512vl(auVar13,auVar15);
      auVar26 = vpaddd_avx512vl(auVar26,auVar18);
      auVar11 = vpxord_avx512vl(auVar39,auVar34);
      auVar35 = vpxord_avx512vl(auVar42,auVar26);
      auVar36 = vprold_avx512vl(auVar11,0x10);
      auVar37 = vprold_avx512vl(auVar12 ^ auVar37,0x10);
      auVar38 = vprold_avx512vl(auVar13 ^ auVar38,0x10);
      auVar35 = vprold_avx512vl(auVar35,0x10);
      auVar21 = vpaddd_avx512vl(auVar21,auVar36);
      auVar11 = vpaddd_avx(auVar40,auVar37);
      auVar14 = vpaddd_avx512vl(auVar14,auVar38);
      auVar23 = vpaddd_avx512vl(auVar23,auVar35);
      auVar17 = vpxord_avx512vl(auVar21,auVar17);
      auVar16 = vpxord_avx512vl(auVar11,auVar16);
      auVar15 = vpxord_avx512vl(auVar14,auVar15);
      auVar18 = vpxord_avx512vl(auVar23,auVar18);
      auVar17 = vprold_avx512vl(auVar17,0x14);
      auVar16 = vprold_avx512vl(auVar16,0x14);
      auVar15 = vprold_avx512vl(auVar15,0x14);
      auVar18 = vprold_avx512vl(auVar18,0x14);
      auVar40 = vpaddd_avx512vl(auVar34,auVar32);
      auVar34 = vpaddd_avx512vl(auVar12,auVar33);
      auVar12 = vpaddd_avx(auVar48,auVar13);
      auVar13 = vpaddd_avx(auVar22,auVar26);
      auVar40 = vpaddd_avx512vl(auVar40,auVar17);
      auVar26 = vpaddd_avx512vl(auVar34,auVar16);
      auVar34 = vpaddd_avx512vl(auVar12,auVar15);
      auVar39 = vpaddd_avx512vl(auVar13,auVar18);
      auVar12 = vpxord_avx512vl(auVar40,auVar36);
      auVar36 = vprold_avx512vl(auVar12,0x18);
      auVar37 = vprold_avx512vl(auVar26 ^ auVar37,0x18);
      auVar38 = vprold_avx512vl(auVar34 ^ auVar38,0x18);
      auVar12 = vpxord_avx512vl(auVar39,auVar35);
      auVar35 = vprold_avx512vl(auVar12,0x18);
      auVar21 = vpaddd_avx512vl(auVar36,auVar21);
      auVar12 = vpaddd_avx(auVar37,auVar11);
      auVar41 = vpaddd_avx512vl(auVar38,auVar14);
      auVar23 = vpaddd_avx512vl(auVar35,auVar23);
      auVar11 = vpxord_avx512vl(auVar21,auVar17);
      auVar13 = vpxord_avx512vl(auVar12,auVar16);
      auVar14 = vpxord_avx512vl(auVar41,auVar15);
      auVar15 = vpxord_avx512vl(auVar23,auVar18);
      auVar18 = vprold_avx512vl(auVar11,0x19);
      auVar17 = vprold_avx512vl(auVar13,0x19);
      auVar16 = vprold_avx512vl(auVar14,0x19);
      auVar42 = vprold_avx512vl(auVar15,0x19);
      auVar13 = vpaddd_avx(auVar27,auVar40);
      auVar40 = vmovdqa64_avx512vl(auVar27);
      auVar14 = vpaddd_avx(auVar28,auVar26);
      auVar15 = vpaddd_avx(auVar24,auVar34);
      auVar26 = vmovdqa64_avx512vl(auVar29);
      auVar11 = vmovdqa64_avx512vl(auVar29);
      auVar29 = vpaddd_avx512vl(auVar39,auVar29);
      auVar13 = vpaddd_avx512vl(auVar13,auVar42);
      auVar14 = vpaddd_avx512vl(auVar14,auVar18);
      auVar15 = vpaddd_avx512vl(auVar15,auVar17);
      auVar29 = vpaddd_avx512vl(auVar29,auVar16);
      auVar34 = vpxord_avx512vl(auVar15,auVar35);
      auVar35 = vpxord_avx512vl(auVar29,auVar36);
      auVar36 = vprold_avx512vl(auVar37 ^ auVar13,0x10);
      auVar37 = vprold_avx512vl(auVar38 ^ auVar14,0x10);
      auVar34 = vprold_avx512vl(auVar34,0x10);
      auVar35 = vprold_avx512vl(auVar35,0x10);
      auVar38 = vpaddd_avx512vl(auVar41,auVar36);
      auVar23 = vpaddd_avx512vl(auVar23,auVar37);
      auVar21 = vpaddd_avx512vl(auVar21,auVar34);
      auVar39 = vpaddd_avx512vl(auVar12,auVar35);
      auVar12 = vpxord_avx512vl(auVar38,auVar42);
      auVar18 = vpxord_avx512vl(auVar23,auVar18);
      auVar17 = vpxord_avx512vl(auVar21,auVar17);
      auVar16 = vpxord_avx512vl(auVar39,auVar16);
      auVar41 = vprold_avx512vl(auVar12,0x14);
      auVar18 = vprold_avx512vl(auVar18,0x14);
      auVar17 = vprold_avx512vl(auVar17,0x14);
      auVar16 = vprold_avx512vl(auVar16,0x14);
      auVar42 = vpaddd_avx512vl(auVar13,auVar31);
      auVar43 = vmovdqa64_avx512vl(auVar31);
      auVar12 = vmovdqa64_avx512vl(auVar31);
      auVar13 = vpaddd_avx(auVar49,auVar14);
      auVar14 = vpaddd_avx(auVar25,auVar15);
      auVar25 = vmovdqa64_avx512vl(auVar25);
      auVar15 = vpaddd_avx(auVar48,auVar29);
      auVar29 = vpaddd_avx512vl(auVar42,auVar41);
      auVar31 = vpaddd_avx512vl(auVar13,auVar18);
      auVar42 = vpaddd_avx512vl(auVar14,auVar17);
      auVar15 = vpaddd_avx512vl(auVar15,auVar16);
      auVar36 = vprold_avx512vl(auVar29 ^ auVar36,0x18);
      auVar37 = vprold_avx512vl(auVar31 ^ auVar37,0x18);
      auVar13 = vpxord_avx512vl(auVar42,auVar34);
      auVar34 = vprold_avx512vl(auVar13,0x18);
      auVar13 = vpxord_avx512vl(auVar15,auVar35);
      auVar35 = vprold_avx512vl(auVar13,0x18);
      auVar38 = vpaddd_avx512vl(auVar36,auVar38);
      auVar23 = vpaddd_avx512vl(auVar37,auVar23);
      auVar21 = vpaddd_avx512vl(auVar34,auVar21);
      auVar39 = vpaddd_avx512vl(auVar35,auVar39);
      auVar13 = vpxord_avx512vl(auVar38,auVar41);
      auVar14 = vpxord_avx512vl(auVar23,auVar18);
      auVar18 = vpxord_avx512vl(auVar21,auVar17);
      auVar17 = vpxord_avx512vl(auVar39,auVar16);
      auVar16 = vprold_avx512vl(auVar13,0x19);
      auVar41 = vprold_avx512vl(auVar14,0x19);
      auVar18 = vprold_avx512vl(auVar18,0x19);
      auVar17 = vprold_avx512vl(auVar17,0x19);
      auVar13 = vpaddd_avx(auVar20,auVar29);
      auVar14 = vpaddd_avx(auVar50,auVar31);
      auVar29 = vpaddd_avx512vl(auVar42,auVar32);
      auVar15 = vpaddd_avx(auVar22,auVar15);
      auVar31 = vpaddd_avx512vl(auVar13,auVar41);
      auVar14 = vpaddd_avx512vl(auVar14,auVar18);
      auVar29 = vpaddd_avx512vl(auVar29,auVar17);
      auVar15 = vpaddd_avx512vl(auVar15,auVar16);
      auVar13 = vpxord_avx512vl(auVar35,auVar31);
      auVar34 = vpxord_avx512vl(auVar34,auVar15);
      auVar35 = vprold_avx512vl(auVar13,0x10);
      auVar36 = vprold_avx512vl(auVar14 ^ auVar36,0x10);
      auVar37 = vprold_avx512vl(auVar29 ^ auVar37,0x10);
      auVar34 = vprold_avx512vl(auVar34,0x10);
      auVar21 = vpaddd_avx512vl(auVar21,auVar35);
      auVar13 = vpaddd_avx(auVar39,auVar36);
      auVar38 = vpaddd_avx512vl(auVar38,auVar37);
      auVar23 = vpaddd_avx512vl(auVar23,auVar34);
      auVar39 = vpxord_avx512vl(auVar21,auVar41);
      auVar18 = vpxord_avx512vl(auVar13,auVar18);
      auVar17 = vpxord_avx512vl(auVar38,auVar17);
      auVar16 = vpxord_avx512vl(auVar23,auVar16);
      auVar39 = vprold_avx512vl(auVar39,0x14);
      auVar18 = vprold_avx512vl(auVar18,0x14);
      auVar17 = vprold_avx512vl(auVar17,0x14);
      auVar16 = vprold_avx512vl(auVar16,0x14);
      auVar31 = vpaddd_avx512vl(auVar31,auVar33);
      auVar41 = vpaddd_avx512vl(auVar14,auVar30);
      auVar14 = vpaddd_avx(auVar47,auVar29);
      auVar44 = vmovdqa64_avx512vl(auVar44);
      auVar15 = vpaddd_avx512vl(auVar15,auVar44);
      auVar29 = vpaddd_avx512vl(auVar31,auVar39);
      auVar31 = vpaddd_avx512vl(auVar41,auVar18);
      auVar41 = vpaddd_avx512vl(auVar14,auVar17);
      auVar42 = vpaddd_avx512vl(auVar15,auVar16);
      auVar14 = vpxord_avx512vl(auVar29,auVar35);
      auVar35 = vprold_avx512vl(auVar14,0x18);
      auVar36 = vprold_avx512vl(auVar31 ^ auVar36,0x18);
      auVar37 = vprold_avx512vl(auVar41 ^ auVar37,0x18);
      auVar14 = vpxord_avx512vl(auVar42,auVar34);
      auVar34 = vprold_avx512vl(auVar14,0x18);
      auVar21 = vpaddd_avx512vl(auVar35,auVar21);
      auVar13 = vpaddd_avx(auVar36,auVar13);
      auVar38 = vpaddd_avx512vl(auVar37,auVar38);
      auVar23 = vpaddd_avx512vl(auVar34,auVar23);
      auVar14 = vpxord_avx512vl(auVar21,auVar39);
      auVar15 = vpxord_avx512vl(auVar13,auVar18);
      auVar18 = vpxord_avx512vl(auVar38,auVar17);
      auVar17 = vpxord_avx512vl(auVar23,auVar16);
      auVar16 = vprold_avx512vl(auVar14,0x19);
      auVar39 = vprold_avx512vl(auVar15,0x19);
      auVar45 = vprold_avx512vl(auVar18,0x19);
      auVar46 = vprold_avx512vl(auVar17,0x19);
      auVar14 = vpaddd_avx(auVar28,auVar29);
      auVar15 = vpaddd_avx(auVar49,auVar31);
      auVar18 = vpaddd_avx(auVar41,auVar48);
      auVar17 = vpaddd_avx(auVar24,auVar42);
      auVar14 = vpaddd_avx512vl(auVar14,auVar46);
      auVar15 = vpaddd_avx512vl(auVar15,auVar16);
      auVar18 = vpaddd_avx512vl(auVar18,auVar39);
      auVar17 = vpaddd_avx512vl(auVar17,auVar45);
      auVar29 = vpxord_avx512vl(auVar18,auVar34);
      auVar31 = vpxord_avx512vl(auVar17,auVar35);
      auVar34 = vprold_avx512vl(auVar36 ^ auVar14,0x10);
      auVar35 = vprold_avx512vl(auVar37 ^ auVar15,0x10);
      auVar29 = vprold_avx512vl(auVar29,0x10);
      auVar31 = vprold_avx512vl(auVar31,0x10);
      auVar36 = vpaddd_avx512vl(auVar38,auVar34);
      auVar23 = vpaddd_avx512vl(auVar23,auVar35);
      auVar21 = vpaddd_avx512vl(auVar21,auVar29);
      auVar37 = vpaddd_avx512vl(auVar13,auVar31);
      auVar13 = vpxord_avx512vl(auVar36,auVar46);
      auVar16 = vpxord_avx512vl(auVar23,auVar16);
      auVar38 = vpxord_avx512vl(auVar21,auVar39);
      auVar39 = vpxord_avx512vl(auVar37,auVar45);
      auVar41 = vprold_avx512vl(auVar13,0x14);
      auVar16 = vprold_avx512vl(auVar16,0x14);
      auVar38 = vprold_avx512vl(auVar38,0x14);
      auVar39 = vprold_avx512vl(auVar39,0x14);
      auVar13 = vpaddd_avx(auVar26,auVar14);
      auVar14 = vpaddd_avx(auVar50,auVar15);
      auVar18 = vpaddd_avx512vl(auVar18,auVar40);
      auVar15 = vpaddd_avx(auVar47,auVar17);
      auVar13 = vpaddd_avx512vl(auVar13,auVar41);
      auVar14 = vpaddd_avx512vl(auVar14,auVar16);
      auVar18 = vpaddd_avx512vl(auVar18,auVar38);
      auVar15 = vpaddd_avx512vl(auVar15,auVar39);
      auVar17 = vprold_avx512vl(auVar13 ^ auVar34,0x18);
      auVar40 = vprold_avx512vl(auVar14 ^ auVar35,0x18);
      auVar26 = vpxord_avx512vl(auVar18,auVar29);
      auVar26 = vprold_avx512vl(auVar26,0x18);
      auVar29 = vpxord_avx512vl(auVar15,auVar31);
      auVar29 = vprold_avx512vl(auVar29,0x18);
      auVar31 = vpaddd_avx512vl(auVar17,auVar36);
      auVar23 = vpaddd_avx512vl(auVar40,auVar23);
      auVar21 = vpaddd_avx512vl(auVar26,auVar21);
      auVar34 = vpaddd_avx512vl(auVar29,auVar37);
      auVar35 = vpxord_avx512vl(auVar31,auVar41);
      auVar16 = vpxord_avx512vl(auVar23,auVar16);
      auVar36 = vpxord_avx512vl(auVar21,auVar38);
      auVar37 = vpxord_avx512vl(auVar34,auVar39);
      auVar35 = vprold_avx512vl(auVar35,0x19);
      auVar16 = vprold_avx512vl(auVar16,0x19);
      auVar36 = vprold_avx512vl(auVar36,0x19);
      auVar37 = vprold_avx512vl(auVar37,0x19);
      auVar13 = vpaddd_avx512vl(auVar13,auVar43);
      auVar14 = vpaddd_avx512vl(auVar14,auVar32);
      auVar18 = vpaddd_avx512vl(auVar18,auVar33);
      auVar15 = vpaddd_avx512vl(auVar15,auVar44);
      auVar44 = vmovdqa64_avx512vl(auVar44);
      auVar38 = vpaddd_avx512vl(auVar13,auVar16);
      auVar14 = vpaddd_avx512vl(auVar14,auVar36);
      auVar18 = vpaddd_avx512vl(auVar18,auVar37);
      auVar15 = vpaddd_avx512vl(auVar15,auVar35);
      auVar13 = vpxord_avx512vl(auVar29,auVar38);
      auVar26 = vpxord_avx512vl(auVar26,auVar15);
      auVar29 = vprold_avx512vl(auVar13,0x10);
      auVar17 = vprold_avx512vl(auVar14 ^ auVar17,0x10);
      auVar40 = vprold_avx512vl(auVar18 ^ auVar40,0x10);
      auVar26 = vprold_avx512vl(auVar26,0x10);
      auVar21 = vpaddd_avx512vl(auVar21,auVar29);
      auVar13 = vpaddd_avx(auVar34,auVar17);
      auVar31 = vpaddd_avx512vl(auVar31,auVar40);
      auVar23 = vpaddd_avx512vl(auVar23,auVar26);
      auVar16 = vpxord_avx512vl(auVar21,auVar16);
      auVar34 = vpxord_avx512vl(auVar13,auVar36);
      auVar36 = vpxord_avx512vl(auVar31,auVar37);
      auVar35 = vpxord_avx512vl(auVar23,auVar35);
      auVar16 = vprold_avx512vl(auVar16,0x14);
      auVar34 = vprold_avx512vl(auVar34,0x14);
      auVar36 = vprold_avx512vl(auVar36,0x14);
      auVar35 = vprold_avx512vl(auVar35,0x14);
      auVar37 = vpaddd_avx512vl(auVar38,auVar30);
      auVar38 = vpaddd_avx512vl(auVar14,auVar25);
      auVar22 = vmovdqa64_avx512vl(auVar22);
      auVar18 = vpaddd_avx512vl(auVar18,auVar22);
      auVar14 = vpaddd_avx(auVar20,auVar15);
      auVar15 = vpaddd_avx512vl(auVar37,auVar16);
      auVar37 = vpaddd_avx512vl(auVar38,auVar34);
      auVar18 = vpaddd_avx512vl(auVar18,auVar36);
      auVar38 = vpaddd_avx512vl(auVar14,auVar35);
      auVar14 = vpxord_avx512vl(auVar15,auVar29);
      auVar29 = vprold_avx512vl(auVar14,0x18);
      auVar39 = vprold_avx512vl(auVar37 ^ auVar17,0x18);
      auVar40 = vprold_avx512vl(auVar18 ^ auVar40,0x18);
      auVar14 = vpxord_avx512vl(auVar38,auVar26);
      auVar26 = vprold_avx512vl(auVar14,0x18);
      auVar21 = vpaddd_avx512vl(auVar29,auVar21);
      auVar13 = vpaddd_avx(auVar39,auVar13);
      auVar31 = vpaddd_avx512vl(auVar40,auVar31);
      auVar23 = vpaddd_avx512vl(auVar26,auVar23);
      auVar14 = vpxord_avx512vl(auVar21,auVar16);
      auVar17 = vpxord_avx512vl(auVar13,auVar34);
      auVar16 = vpxord_avx512vl(auVar31,auVar36);
      auVar34 = vpxord_avx512vl(auVar23,auVar35);
      auVar35 = vprold_avx512vl(auVar14,0x19);
      auVar36 = vprold_avx512vl(auVar17,0x19);
      auVar16 = vprold_avx512vl(auVar16,0x19);
      auVar34 = vprold_avx512vl(auVar34,0x19);
      auVar14 = vpaddd_avx(auVar49,auVar15);
      auVar15 = vpaddd_avx(auVar50,auVar37);
      auVar18 = vpaddd_avx(auVar47,auVar18);
      auVar47 = vmovdqa64_avx512vl(auVar47);
      auVar17 = vpaddd_avx(auVar38,auVar48);
      auVar14 = vpaddd_avx512vl(auVar14,auVar34);
      auVar15 = vpaddd_avx512vl(auVar15,auVar35);
      auVar18 = vpaddd_avx512vl(auVar18,auVar36);
      auVar17 = vpaddd_avx512vl(auVar17,auVar16);
      auVar26 = vpxord_avx512vl(auVar18,auVar26);
      auVar29 = vpxord_avx512vl(auVar17,auVar29);
      auVar37 = vprold_avx512vl(auVar39 ^ auVar14,0x10);
      auVar40 = vprold_avx512vl(auVar40 ^ auVar15,0x10);
      auVar26 = vprold_avx512vl(auVar26,0x10);
      auVar29 = vprold_avx512vl(auVar29,0x10);
      auVar31 = vpaddd_avx512vl(auVar31,auVar37);
      auVar23 = vpaddd_avx512vl(auVar23,auVar40);
      auVar21 = vpaddd_avx512vl(auVar21,auVar26);
      auVar38 = vpaddd_avx512vl(auVar13,auVar29);
      auVar13 = vpxord_avx512vl(auVar31,auVar34);
      auVar34 = vpxord_avx512vl(auVar23,auVar35);
      auVar35 = vpxord_avx512vl(auVar21,auVar36);
      auVar16 = vpxord_avx512vl(auVar38,auVar16);
      auVar36 = vprold_avx512vl(auVar13,0x14);
      auVar34 = vprold_avx512vl(auVar34,0x14);
      auVar35 = vprold_avx512vl(auVar35,0x14);
      auVar16 = vprold_avx512vl(auVar16,0x14);
      auVar13 = vpaddd_avx(auVar24,auVar14);
      auVar15 = vpaddd_avx512vl(auVar15,auVar32);
      auVar14 = vpaddd_avx(auVar28,auVar18);
      auVar18 = vpaddd_avx512vl(auVar17,auVar22);
      auVar13 = vpaddd_avx512vl(auVar13,auVar36);
      auVar15 = vpaddd_avx512vl(auVar15,auVar34);
      auVar14 = vpaddd_avx512vl(auVar14,auVar35);
      auVar18 = vpaddd_avx512vl(auVar18,auVar16);
      auVar17 = vprold_avx512vl(auVar13 ^ auVar37,0x18);
      auVar40 = vprold_avx512vl(auVar15 ^ auVar40,0x18);
      auVar26 = vpxord_avx512vl(auVar14,auVar26);
      auVar26 = vprold_avx512vl(auVar26,0x18);
      auVar29 = vpxord_avx512vl(auVar18,auVar29);
      auVar29 = vprold_avx512vl(auVar29,0x18);
      auVar31 = vpaddd_avx512vl(auVar17,auVar31);
      auVar23 = vpaddd_avx512vl(auVar40,auVar23);
      auVar21 = vpaddd_avx512vl(auVar26,auVar21);
      auVar37 = vpaddd_avx512vl(auVar29,auVar38);
      auVar36 = vpxord_avx512vl(auVar31,auVar36);
      auVar34 = vpxord_avx512vl(auVar23,auVar34);
      auVar35 = vpxord_avx512vl(auVar21,auVar35);
      auVar16 = vpxord_avx512vl(auVar37,auVar16);
      auVar36 = vprold_avx512vl(auVar36,0x19);
      auVar34 = vprold_avx512vl(auVar34,0x19);
      auVar35 = vprold_avx512vl(auVar35,0x19);
      auVar16 = vprold_avx512vl(auVar16,0x19);
      auVar13 = vpaddd_avx(auVar11,auVar13);
      auVar38 = vmovdqa64_avx512vl(auVar33);
      auVar15 = vpaddd_avx512vl(auVar15,auVar33);
      auVar33 = vpaddd_avx512vl(auVar14,auVar30);
      auVar14 = vpaddd_avx(auVar20,auVar18);
      auVar18 = vpaddd_avx512vl(auVar13,auVar34);
      auVar15 = vpaddd_avx512vl(auVar15,auVar35);
      auVar33 = vpaddd_avx512vl(auVar33,auVar16);
      auVar39 = vpaddd_avx512vl(auVar14,auVar36);
      auVar13 = vpxord_avx512vl(auVar29,auVar18);
      auVar14 = vpxord_avx512vl(auVar26,auVar39);
      auVar26 = vprold_avx512vl(auVar13,0x10);
      auVar17 = vprold_avx512vl(auVar15 ^ auVar17,0x10);
      auVar40 = vprold_avx512vl(auVar33 ^ auVar40,0x10);
      auVar29 = vprold_avx512vl(auVar14,0x10);
      auVar21 = vpaddd_avx512vl(auVar21,auVar26);
      auVar13 = vpaddd_avx(auVar37,auVar17);
      auVar31 = vpaddd_avx512vl(auVar31,auVar40);
      auVar23 = vpaddd_avx512vl(auVar23,auVar29);
      auVar14 = vpxord_avx512vl(auVar21,auVar34);
      auVar34 = vpxord_avx512vl(auVar13,auVar35);
      auVar16 = vpxord_avx512vl(auVar31,auVar16);
      auVar35 = vpxord_avx512vl(auVar23,auVar36);
      auVar36 = vprold_avx512vl(auVar14,0x14);
      auVar34 = vprold_avx512vl(auVar34,0x14);
      auVar16 = vprold_avx512vl(auVar16,0x14);
      auVar35 = vprold_avx512vl(auVar35,0x14);
      auVar37 = vpaddd_avx512vl(auVar18,auVar25);
      auVar14 = vpaddd_avx(auVar27,auVar15);
      auVar41 = vmovdqa64_avx512vl(auVar44);
      auVar15 = vpaddd_avx(auVar44,auVar33);
      auVar18 = vpaddd_avx(auVar12,auVar39);
      auVar44 = vpaddd_avx512vl(auVar37,auVar36);
      auVar33 = vpaddd_avx512vl(auVar14,auVar34);
      auVar15 = vpaddd_avx512vl(auVar15,auVar16);
      auVar18 = vpaddd_avx512vl(auVar18,auVar35);
      auVar14 = vpxord_avx512vl(auVar44,auVar26);
      auVar26 = vprold_avx512vl(auVar14,0x18);
      auVar17 = vprold_avx512vl(auVar33 ^ auVar17,0x18);
      auVar40 = vprold_avx512vl(auVar15 ^ auVar40,0x18);
      auVar14 = vpxord_avx512vl(auVar18,auVar29);
      auVar29 = vprold_avx512vl(auVar14,0x18);
      auVar21 = vpaddd_avx512vl(auVar26,auVar21);
      auVar13 = vpaddd_avx(auVar17,auVar13);
      auVar31 = vpaddd_avx512vl(auVar40,auVar31);
      auVar23 = vpaddd_avx512vl(auVar29,auVar23);
      auVar14 = vpxord_avx512vl(auVar21,auVar36);
      auVar34 = vpxord_avx512vl(auVar13,auVar34);
      auVar16 = vpxord_avx512vl(auVar31,auVar16);
      auVar35 = vpxord_avx512vl(auVar23,auVar35);
      auVar36 = vprold_avx512vl(auVar14,0x19);
      auVar34 = vprold_avx512vl(auVar34,0x19);
      auVar16 = vprold_avx512vl(auVar16,0x19);
      auVar35 = vprold_avx512vl(auVar35,0x19);
      auVar14 = vpaddd_avx(auVar50,auVar44);
      auVar44 = vpaddd_avx512vl(auVar33,auVar32);
      auVar15 = vpaddd_avx512vl(auVar15,auVar22);
      auVar18 = vpaddd_avx512vl(auVar18,auVar47);
      auVar14 = vpaddd_avx512vl(auVar14,auVar35);
      auVar44 = vpaddd_avx512vl(auVar44,auVar36);
      auVar15 = vpaddd_avx512vl(auVar15,auVar34);
      auVar18 = vpaddd_avx512vl(auVar18,auVar16);
      auVar29 = vpxord_avx512vl(auVar15,auVar29);
      auVar26 = vpxord_avx512vl(auVar18,auVar26);
      auVar17 = vprold_avx512vl(auVar17 ^ auVar14,0x10);
      auVar40 = vprold_avx512vl(auVar40 ^ auVar44,0x10);
      auVar29 = vprold_avx512vl(auVar29,0x10);
      auVar26 = vprold_avx512vl(auVar26,0x10);
      auVar31 = vpaddd_avx512vl(auVar31,auVar17);
      auVar23 = vpaddd_avx512vl(auVar23,auVar40);
      auVar21 = vpaddd_avx512vl(auVar21,auVar29);
      auVar33 = vpaddd_avx512vl(auVar13,auVar26);
      auVar13 = vpxord_avx512vl(auVar31,auVar35);
      auVar35 = vpxord_avx512vl(auVar23,auVar36);
      auVar34 = vpxord_avx512vl(auVar21,auVar34);
      auVar16 = vpxord_avx512vl(auVar33,auVar16);
      auVar36 = vprold_avx512vl(auVar13,0x14);
      auVar35 = vprold_avx512vl(auVar35,0x14);
      auVar34 = vprold_avx512vl(auVar34,0x14);
      auVar16 = vprold_avx512vl(auVar16,0x14);
      auVar13 = vpaddd_avx(auVar14,auVar48);
      auVar44 = vpaddd_avx512vl(auVar44,auVar38);
      auVar14 = vpaddd_avx(auVar49,auVar15);
      auVar15 = vpaddd_avx512vl(auVar18,auVar41);
      auVar13 = vpaddd_avx512vl(auVar13,auVar36);
      auVar18 = vpaddd_avx512vl(auVar44,auVar35);
      auVar14 = vpaddd_avx512vl(auVar14,auVar34);
      auVar15 = vpaddd_avx512vl(auVar15,auVar16);
      auVar17 = vprold_avx512vl(auVar13 ^ auVar17,0x18);
      auVar44 = vprold_avx512vl(auVar18 ^ auVar40,0x18);
      auVar40 = vpxord_avx512vl(auVar14,auVar29);
      auVar40 = vprold_avx512vl(auVar40,0x18);
      auVar26 = vpxord_avx512vl(auVar15,auVar26);
      auVar26 = vprold_avx512vl(auVar26,0x18);
      auVar29 = vpaddd_avx512vl(auVar17,auVar31);
      auVar23 = vpaddd_avx512vl(auVar44,auVar23);
      auVar21 = vpaddd_avx512vl(auVar40,auVar21);
      auVar31 = vpaddd_avx512vl(auVar26,auVar33);
      auVar33 = vpxord_avx512vl(auVar29,auVar36);
      auVar35 = vpxord_avx512vl(auVar23,auVar35);
      auVar34 = vpxord_avx512vl(auVar21,auVar34);
      auVar16 = vpxord_avx512vl(auVar31,auVar16);
      auVar33 = vprold_avx512vl(auVar33,0x19);
      auVar35 = vprold_avx512vl(auVar35,0x19);
      auVar34 = vprold_avx512vl(auVar34,0x19);
      auVar16 = vprold_avx512vl(auVar16,0x19);
      auVar13 = vpaddd_avx(auVar24,auVar13);
      auVar18 = vpaddd_avx512vl(auVar18,auVar30);
      auVar36 = vpaddd_avx512vl(auVar14,auVar25);
      auVar14 = vpaddd_avx(auVar12,auVar15);
      auVar15 = vpaddd_avx512vl(auVar13,auVar35);
      auVar18 = vpaddd_avx512vl(auVar18,auVar34);
      auVar36 = vpaddd_avx512vl(auVar36,auVar16);
      auVar37 = vpaddd_avx512vl(auVar14,auVar33);
      auVar13 = vpxord_avx512vl(auVar26,auVar15);
      auVar14 = vpxord_avx512vl(auVar40,auVar37);
      auVar40 = vprold_avx512vl(auVar13,0x10);
      auVar26 = vprold_avx512vl(auVar18 ^ auVar17,0x10);
      auVar44 = vprold_avx512vl(auVar36 ^ auVar44,0x10);
      auVar39 = vprold_avx512vl(auVar14,0x10);
      auVar21 = vpaddd_avx512vl(auVar21,auVar40);
      auVar13 = vpaddd_avx(auVar31,auVar26);
      auVar29 = vpaddd_avx512vl(auVar29,auVar44);
      auVar23 = vpaddd_avx512vl(auVar23,auVar39);
      auVar14 = vpxord_avx512vl(auVar21,auVar35);
      auVar17 = vpxord_avx512vl(auVar13,auVar34);
      auVar16 = vpxord_avx512vl(auVar29,auVar16);
      auVar31 = vpxord_avx512vl(auVar23,auVar33);
      auVar33 = vprold_avx512vl(auVar14,0x14);
      auVar34 = vprold_avx512vl(auVar17,0x14);
      auVar16 = vprold_avx512vl(auVar16,0x14);
      auVar31 = vprold_avx512vl(auVar31,0x14);
      auVar14 = vpaddd_avx(auVar27,auVar15);
      auVar15 = vpaddd_avx(auVar28,auVar18);
      auVar18 = vpaddd_avx(auVar20,auVar36);
      auVar17 = vpaddd_avx(auVar11,auVar37);
      auVar14 = vpaddd_avx512vl(auVar14,auVar33);
      auVar15 = vpaddd_avx512vl(auVar15,auVar34);
      auVar18 = vpaddd_avx512vl(auVar18,auVar16);
      auVar17 = vpaddd_avx512vl(auVar17,auVar31);
      auVar40 = vpxord_avx512vl(auVar14,auVar40);
      auVar40 = vprold_avx512vl(auVar40,0x18);
      auVar26 = vprold_avx512vl(auVar15 ^ auVar26,0x18);
      auVar44 = vprold_avx512vl(auVar18 ^ auVar44,0x18);
      auVar35 = vpxord_avx512vl(auVar17,auVar39);
      auVar35 = vprold_avx512vl(auVar35,0x18);
      auVar21 = vpaddd_avx512vl(auVar40,auVar21);
      auVar13 = vpaddd_avx(auVar26,auVar13);
      auVar29 = vpaddd_avx512vl(auVar44,auVar29);
      auVar23 = vpaddd_avx512vl(auVar35,auVar23);
      auVar33 = vpxord_avx512vl(auVar21,auVar33);
      auVar34 = vpxord_avx512vl(auVar13,auVar34);
      auVar16 = vpxord_avx512vl(auVar29,auVar16);
      auVar31 = vpxord_avx512vl(auVar23,auVar31);
      auVar33 = vprold_avx512vl(auVar33,0x19);
      auVar34 = vprold_avx512vl(auVar34,0x19);
      auVar16 = vprold_avx512vl(auVar16,0x19);
      auVar31 = vprold_avx512vl(auVar31,0x19);
      auVar14 = vpaddd_avx512vl(auVar14,auVar32);
      auVar15 = vpaddd_avx512vl(auVar15,auVar38);
      auVar18 = vpaddd_avx512vl(auVar18,auVar41);
      auVar17 = vpaddd_avx512vl(auVar17,auVar22);
      auVar14 = vpaddd_avx512vl(auVar14,auVar31);
      auVar15 = vpaddd_avx512vl(auVar15,auVar33);
      auVar18 = vpaddd_avx512vl(auVar18,auVar34);
      auVar17 = vpaddd_avx512vl(auVar17,auVar16);
      auVar35 = vpxord_avx512vl(auVar18,auVar35);
      auVar40 = vpxord_avx512vl(auVar17,auVar40);
      auVar26 = vprold_avx512vl(auVar26 ^ auVar14,0x10);
      auVar44 = vprold_avx512vl(auVar44 ^ auVar15,0x10);
      auVar35 = vprold_avx512vl(auVar35,0x10);
      auVar40 = vprold_avx512vl(auVar40,0x10);
      auVar29 = vpaddd_avx512vl(auVar29,auVar26);
      auVar23 = vpaddd_avx512vl(auVar23,auVar44);
      auVar21 = vpaddd_avx512vl(auVar21,auVar35);
      auVar36 = vpaddd_avx512vl(auVar13,auVar40);
      auVar13 = vpxord_avx512vl(auVar29,auVar31);
      auVar31 = vpxord_avx512vl(auVar23,auVar33);
      auVar33 = vpxord_avx512vl(auVar21,auVar34);
      auVar16 = vpxord_avx512vl(auVar36,auVar16);
      auVar34 = vprold_avx512vl(auVar13,0x14);
      auVar31 = vprold_avx512vl(auVar31,0x14);
      auVar33 = vprold_avx512vl(auVar33,0x14);
      auVar16 = vprold_avx512vl(auVar16,0x14);
      auVar37 = vmovdqa64_avx512vl(auVar47);
      auVar14 = vpaddd_avx512vl(auVar14,auVar47);
      auVar15 = vpaddd_avx512vl(auVar15,auVar30);
      auVar13 = vpaddd_avx(auVar50,auVar18);
      auVar18 = vpaddd_avx512vl(auVar17,auVar20);
      auVar17 = vmovdqa64_avx512vl(auVar20);
      auVar20 = vpaddd_avx512vl(auVar14,auVar34);
      auVar47 = vpaddd_avx512vl(auVar15,auVar31);
      auVar13 = vpaddd_avx(auVar13,auVar33);
      auVar39 = vpaddd_avx512vl(auVar18,auVar16);
      auVar44 = vprold_avx512vl(auVar47 ^ auVar44,0x18);
      auVar14 = vpxord_avx512vl(auVar13,auVar35);
      auVar35 = vprold_avx512vl(auVar14,0x18);
      auVar14 = vpxord_avx512vl(auVar39,auVar40);
      auVar18 = vprold_avx512vl(auVar14,0x18);
      auVar23 = vpaddd_avx512vl(auVar44,auVar23);
      auVar21 = vpaddd_avx512vl(auVar35,auVar21);
      auVar14 = vpaddd_avx(auVar18,auVar36);
      auVar15 = vpxord_avx512vl(auVar23,auVar31);
      auVar40 = vprold_avx512vl(auVar15,0x19);
      auVar31 = vmovdqa64_avx512vl(auVar48);
      auVar15 = vpaddd_avx(auVar48,auVar20);
      auVar15 = vpaddd_avx(auVar15,auVar40);
      auVar48 = vprold_avx512vl(auVar18 ^ auVar15,0x10);
      auVar36 = vpaddd_avx512vl(auVar21,auVar48);
      auVar18 = vpxord_avx512vl(auVar36,auVar40);
      auVar40 = vprold_avx512vl(auVar18,0x14);
      auVar15 = vpaddd_avx(auVar28,auVar15);
      auVar42 = vpaddd_avx512vl(auVar15,auVar40);
      auVar38 = vpaddd_avx512vl(auVar42,auVar38);
      auVar18 = vprold_avx512vl(auVar20 ^ auVar26,0x18);
      auVar20 = vpaddd_avx512vl(auVar18,auVar29);
      auVar21 = vprold_avx512vl(auVar21 ^ auVar33,0x19);
      auVar26 = vmovdqa64_avx512vl(auVar25);
      auVar15 = vpaddd_avx512vl(auVar47,auVar25);
      auVar15 = vpaddd_avx(auVar15,auVar21);
      auVar47 = vprold_avx512vl(auVar15 ^ auVar18,0x10);
      auVar18 = vpaddd_avx(auVar14,auVar47);
      auVar21 = vprold_avx512vl(auVar18 ^ auVar21,0x14);
      auVar15 = vpaddd_avx(auVar15,auVar49);
      auVar15 = vpaddd_avx(auVar15,auVar21);
      auVar25 = vpaddd_avx512vl(auVar15,auVar30);
      auVar29 = vpxord_avx512vl(auVar20,auVar34);
      auVar14 = vprold_avx512vl(auVar16 ^ auVar14,0x19);
      auVar13 = vpaddd_avx(auVar27,auVar13);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar16 = vpxord_avx512vl(auVar13,auVar44);
      auVar16 = vprold_avx512vl(auVar16,0x10);
      auVar20 = vpaddd_avx512vl(auVar20,auVar16);
      auVar14 = vprold_avx512vl(auVar14 ^ auVar20,0x14);
      auVar44 = vmovdqa64_avx512vl(auVar12);
      auVar12 = vpaddd_avx512vl(auVar13,auVar44);
      auVar12 = vpaddd_avx(auVar14,auVar12);
      auVar13 = vpxord_avx512vl(auVar12,auVar16);
      auVar17 = vpaddd_avx512vl(auVar12,auVar17);
      auVar12 = vprold_avx512vl(auVar29,0x19);
      auVar16 = vmovdqa64_avx512vl(auVar11);
      auVar11 = vpaddd_avx512vl(auVar39,auVar16);
      auVar11 = vpaddd_avx(auVar11,auVar12);
      auVar29 = vpxord_avx512vl(auVar35,auVar11);
      auVar29 = vprold_avx512vl(auVar29,0x10);
      auVar23 = vpaddd_avx512vl(auVar23,auVar29);
      auVar12 = vpxord_avx512vl(auVar23,auVar12);
      auVar12 = vprold_avx512vl(auVar12,0x14);
      auVar11 = vpaddd_avx(auVar11,auVar24);
      auVar11 = vpaddd_avx512vl(auVar11,auVar12);
      auVar29 = vpxord_avx512vl(auVar11,auVar29);
      auVar30 = vpaddd_avx512vl(auVar11,auVar41);
      auVar15 = vprold_avx512vl(auVar15 ^ auVar47,0x18);
      auVar47 = vprold_avx512vl(auVar29,0x18);
      auVar29 = vpaddd_avx512vl(auVar15,auVar18);
      auVar18 = vpaddd_avx512vl(auVar47,auVar23);
      auVar11 = vpxord_avx512vl(auVar18,auVar12);
      auVar23 = vprold_avx512vl(auVar11,0x19);
      auVar11 = vpaddd_avx(auVar38,auVar23);
      auVar22 = vpaddd_avx512vl(auVar11,auVar22);
      auVar48 = vprold_avx512vl(auVar42 ^ auVar48,0x18);
      auVar12 = vprold_avx512vl(auVar13,0x18);
      auVar33 = vpaddd_avx512vl(auVar48,auVar36);
      auVar13 = vpaddd_avx512vl(auVar12,auVar20);
      auVar20 = vpxord_avx512vl(auVar33,auVar40);
      auVar20 = vprold_avx512vl(auVar20,0x19);
      auVar40 = vpaddd_avx512vl(auVar25,auVar20);
      auVar25 = vpxord_avx512vl(auVar12,auVar40);
      auVar12 = vpaddd_avx(auVar26,auVar40);
      auVar21 = vpxord_avx512vl(auVar29,auVar21);
      auVar21 = vprold_avx512vl(auVar21,0x19);
      auVar17 = vpaddd_avx512vl(auVar17,auVar21);
      auVar40 = vpaddd_avx512vl(auVar17,auVar32);
      auVar26 = vprold_avx512vl(auVar14 ^ auVar13,0x19);
      auVar14 = vpaddd_avx512vl(auVar30,auVar26);
      auVar48 = vpxord_avx512vl(auVar14,auVar48);
      auVar44 = vpaddd_avx512vl(auVar14,auVar44);
      auVar30 = vprold_avx512vl(auVar15 ^ auVar11,0x10);
      auVar11 = vpaddd_avx(auVar13,auVar30);
      auVar23 = vprold_avx512vl(auVar11 ^ auVar23,0x14);
      auVar13 = vpaddd_avx(auVar22,auVar23);
      auVar14 = vpaddd_avx(auVar37,auVar13);
      auVar22 = vprold_avx512vl(auVar25,0x10);
      auVar15 = vpaddd_avx(auVar18,auVar22);
      auVar18 = vpxord_avx512vl(auVar15,auVar20);
      auVar20 = vprold_avx512vl(auVar18,0x14);
      auVar12 = vpaddd_avx(auVar12,auVar20);
      auVar18 = vpaddd_avx(auVar27,auVar12);
      auVar47 = vprold_avx512vl(auVar47 ^ auVar17,0x10);
      auVar25 = vpaddd_avx512vl(auVar33,auVar47);
      auVar21 = vprold_avx512vl(auVar25 ^ auVar21,0x14);
      auVar40 = vpaddd_avx512vl(auVar40,auVar21);
      auVar17 = vpaddd_avx(auVar40,auVar28);
      auVar48 = vprold_avx512vl(auVar48,0x10);
      auVar27 = vpaddd_avx512vl(auVar29,auVar48);
      auVar26 = vpxord_avx512vl(auVar27,auVar26);
      auVar26 = vprold_avx512vl(auVar26,0x14);
      auVar44 = vpaddd_avx512vl(auVar44,auVar26);
      auVar48 = vpxord_avx512vl(auVar44,auVar48);
      auVar24 = vpaddd_avx512vl(auVar44,auVar24);
      auVar22 = vprold_avx512vl(auVar12 ^ auVar22,0x18);
      auVar48 = vprold_avx512vl(auVar48,0x18);
      auVar12 = vpaddd_avx(auVar22,auVar15);
      auVar44 = vpaddd_avx512vl(auVar48,auVar27);
      auVar20 = vprold_avx512vl(auVar12 ^ auVar20,0x19);
      auVar14 = vpaddd_avx(auVar14,auVar20);
      auVar48 = vpxord_avx512vl(auVar48,auVar14);
      auVar14 = vpaddd_avx(auVar49,auVar14);
      auVar49 = vprold_avx512vl(auVar13 ^ auVar30,0x18);
      auVar47 = vprold_avx512vl(auVar40 ^ auVar47,0x18);
      auVar11 = vpaddd_avx(auVar49,auVar11);
      auVar13 = vpaddd_avx(auVar47,auVar25);
      auVar21 = vprold_avx512vl(auVar13 ^ auVar21,0x19);
      auVar15 = vpaddd_avx(auVar21,auVar18);
      auVar18 = vpaddd_avx(auVar15,auVar50);
      auVar50 = vprold_avx512vl(auVar44 ^ auVar26,0x19);
      auVar17 = vpaddd_avx(auVar17,auVar50);
      auVar40 = vpaddd_avx512vl(auVar17,auVar16);
      auVar23 = vprold_avx512vl(auVar11 ^ auVar23,0x19);
      auVar16 = vpaddd_avx(auVar24,auVar23);
      auVar24 = vpaddd_avx512vl(auVar16,auVar31);
      auVar48 = vprold_avx512vl(auVar48,0x10);
      auVar22 = vprold_avx512vl(auVar17 ^ auVar22,0x10);
      auVar13 = vpaddd_avx(auVar13,auVar48);
      auVar11 = vpaddd_avx(auVar11,auVar22);
      auVar25 = vprold_avx512vl(auVar13 ^ auVar20,0x14);
      auVar50 = vprold_avx512vl(auVar50 ^ auVar11,0x14);
      auVar14 = vpaddd_avx(auVar14,auVar25);
      auVar17 = vpaddd_avx(auVar40,auVar50);
      auVar40 = vprold_avx512vl(auVar17 ^ auVar22,0x18);
      auVar20 = vpaddd_avx(auVar40,auVar11);
      auVar11 = vpxord_avx512vl(auVar20,auVar14);
      auVar49 = vprold_avx512vl(auVar15 ^ auVar49,0x10);
      auVar47 = vprold_avx512vl(auVar47 ^ auVar16,0x10);
      auVar15 = vpaddd_avx(auVar44,auVar49);
      auVar12 = vpaddd_avx(auVar12,auVar47);
      auVar44 = vprold_avx512vl(auVar21 ^ auVar15,0x14);
      auVar23 = vprold_avx512vl(auVar12 ^ auVar23,0x14);
      auVar18 = vpaddd_avx(auVar44,auVar18);
      auVar16 = vpaddd_avx(auVar24,auVar23);
      auVar24 = vprold_avx512vl(auVar16 ^ auVar47,0x18);
      auVar47 = vpaddd_avx(auVar24,auVar12);
      auVar12 = vpxord_avx512vl(auVar47,auVar18);
      auVar48 = vprold_avx512vl(auVar48 ^ auVar14,0x18);
      auVar22 = vpaddd_avx(auVar13,auVar48);
      auVar13 = vpxord_avx512vl(auVar22,auVar17);
      auVar17 = vprold_avx512vl(auVar18 ^ auVar49,0x18);
      auVar18 = vpaddd_avx(auVar17,auVar15);
      auVar14 = vpxord_avx512vl(auVar18,auVar16);
      auVar15 = vprold_avx512vl(auVar47 ^ auVar23,0x19);
      auVar15 = vpxord_avx512vl(auVar17,auVar15);
      auVar17 = vprold_avx512vl(auVar22 ^ auVar25,0x19);
      auVar16 = vpxord_avx512vl(auVar40,auVar17);
      auVar18 = vprold_avx512vl(auVar44 ^ auVar18,0x19);
      auVar17 = vpxord_avx512vl(auVar18,auVar24);
      auVar18 = vprold_avx512vl(auVar50 ^ auVar20,0x19);
      auVar18 = vpxord_avx512vl(auVar18,auVar48);
      sVar5 = sVar6;
      bVar7 = flags;
    } while (sVar6 != blocks);
  }
  auVar51 = vpunpckldq_avx512vl(auVar11,auVar12);
  auVar12 = vpunpckhdq_avx512vl(auVar11,auVar12);
  auVar11 = vpunpckldq_avx512vl(auVar13,auVar14);
  auVar13 = vpunpckhdq_avx512vl(auVar13,auVar14);
  auVar19 = vpunpcklqdq_avx(auVar51,auVar11);
  auVar11 = vpunpckhqdq_avx(auVar51,auVar11);
  auVar51 = vpunpcklqdq_avx(auVar12,auVar13);
  auVar12 = vpunpckhqdq_avx(auVar12,auVar13);
  auVar13 = vpunpckldq_avx512vl(auVar15,auVar16);
  auVar14 = vpunpckhdq_avx512vl(auVar15,auVar16);
  auVar16 = vpunpckldq_avx512vl(auVar17,auVar18);
  auVar17 = vpunpckhdq_avx512vl(auVar17,auVar18);
  auVar15 = vpunpcklqdq_avx(auVar13,auVar16);
  auVar13 = vpunpckhqdq_avx(auVar13,auVar16);
  auVar18 = vpunpcklqdq_avx(auVar14,auVar17);
  auVar14 = vpunpckhqdq_avx(auVar14,auVar17);
  *(undefined1 (*) [16])out = auVar19;
  *(undefined1 (*) [16])(out + 0x10) = auVar15;
  *(undefined1 (*) [16])(out + 0x20) = auVar11;
  *(undefined1 (*) [16])(out + 0x30) = auVar13;
  *(undefined1 (*) [16])(out + 0x40) = auVar51;
  *(undefined1 (*) [16])(out + 0x50) = auVar18;
  *(undefined1 (*) [16])(out + 0x60) = auVar12;
  *(undefined1 (*) [16])(out + 0x70) = auVar14;
  return;
}

Assistant:

void blake3_hash4_sse2(const uint8_t *const *inputs, size_t blocks,
                       const uint32_t key[8], uint64_t counter,
                       bool increment_counter, uint8_t flags,
                       uint8_t flags_start, uint8_t flags_end, uint8_t *out) {
  __m128i h_vecs[8] = {
      set1(key[0]), set1(key[1]), set1(key[2]), set1(key[3]),
      set1(key[4]), set1(key[5]), set1(key[6]), set1(key[7]),
  };
  __m128i counter_low_vec, counter_high_vec;
  load_counters(counter, increment_counter, &counter_low_vec,
                &counter_high_vec);
  uint8_t block_flags = flags | flags_start;

  for (size_t block = 0; block < blocks; block++) {
    if (block + 1 == blocks) {
      block_flags |= flags_end;
    }
    __m128i block_len_vec = set1(BLAKE3_BLOCK_LEN);
    __m128i block_flags_vec = set1(block_flags);
    __m128i msg_vecs[16];
    transpose_msg_vecs(inputs, block * BLAKE3_BLOCK_LEN, msg_vecs);

    __m128i v[16] = {
        h_vecs[0],       h_vecs[1],        h_vecs[2],     h_vecs[3],
        h_vecs[4],       h_vecs[5],        h_vecs[6],     h_vecs[7],
        set1(IV[0]),     set1(IV[1]),      set1(IV[2]),   set1(IV[3]),
        counter_low_vec, counter_high_vec, block_len_vec, block_flags_vec,
    };
    round_fn(v, msg_vecs, 0);
    round_fn(v, msg_vecs, 1);
    round_fn(v, msg_vecs, 2);
    round_fn(v, msg_vecs, 3);
    round_fn(v, msg_vecs, 4);
    round_fn(v, msg_vecs, 5);
    round_fn(v, msg_vecs, 6);
    h_vecs[0] = xorv(v[0], v[8]);
    h_vecs[1] = xorv(v[1], v[9]);
    h_vecs[2] = xorv(v[2], v[10]);
    h_vecs[3] = xorv(v[3], v[11]);
    h_vecs[4] = xorv(v[4], v[12]);
    h_vecs[5] = xorv(v[5], v[13]);
    h_vecs[6] = xorv(v[6], v[14]);
    h_vecs[7] = xorv(v[7], v[15]);

    block_flags = flags;
  }

  transpose_vecs(&h_vecs[0]);
  transpose_vecs(&h_vecs[4]);
  // The first four vecs now contain the first half of each output, and the
  // second four vecs contain the second half of each output.
  storeu(h_vecs[0], &out[0 * sizeof(__m128i)]);
  storeu(h_vecs[4], &out[1 * sizeof(__m128i)]);
  storeu(h_vecs[1], &out[2 * sizeof(__m128i)]);
  storeu(h_vecs[5], &out[3 * sizeof(__m128i)]);
  storeu(h_vecs[2], &out[4 * sizeof(__m128i)]);
  storeu(h_vecs[6], &out[5 * sizeof(__m128i)]);
  storeu(h_vecs[3], &out[6 * sizeof(__m128i)]);
  storeu(h_vecs[7], &out[7 * sizeof(__m128i)]);
}